

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTSize lj_ctype_vlsize(CTState *cts,CType *ct,CTSize nelem)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  CTypeID1 CVar5;
  
  uVar4 = 0;
  if ((ct->info & 0xf0000000) == 0x10000000) {
    uVar2 = ct->size;
    CVar5 = ct->sib;
    if (CVar5 != 0) {
      uVar4 = 0;
      do {
        uVar1 = cts->tab[CVar5].info;
        if ((uVar1 & 0xf0000000) == 0x90000000) {
          uVar4 = uVar1 & 0xffff;
        }
        CVar5 = cts->tab[CVar5].sib;
      } while (CVar5 != 0);
    }
    ct = cts->tab + uVar4;
  }
  else {
    uVar2 = 0;
  }
  uVar3 = (ulong)nelem * (ulong)cts->tab[(ushort)ct->info].size + (ulong)uVar2;
  return -(uint)(uVar3 >> 0x1f != 0) | (uint)uVar3;
}

Assistant:

CTSize lj_ctype_vlsize(CTState *cts, CType *ct, CTSize nelem)
{
  uint64_t xsz = 0;
  if (ctype_isstruct(ct->info)) {
    CTypeID arrid = 0, fid = ct->sib;
    xsz = ct->size;  /* Add the struct size. */
    while (fid) {
      CType *ctf = ctype_get(cts, fid);
      if (ctype_type(ctf->info) == CT_FIELD)
	arrid = ctype_cid(ctf->info);  /* Remember last field of VLS. */
      fid = ctf->sib;
    }
    ct = ctype_raw(cts, arrid);
  }
  lua_assert(ctype_isvlarray(ct->info));  /* Must be a VLA. */
  ct = ctype_rawchild(cts, ct);  /* Get array element. */
  lua_assert(ctype_hassize(ct->info));
  /* Calculate actual size of VLA and check for overflow. */
  xsz += (uint64_t)ct->size * nelem;
  return xsz < 0x80000000u ? (CTSize)xsz : CTSIZE_INVALID;
}